

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::session_impl::refresh_torrent_status
          (session_impl *this,
          vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_> *ret,
          status_flags_t flags)

{
  bool bVar1;
  element_type *this_00;
  undefined1 local_50 [8];
  shared_ptr<libtorrent::aux::torrent> t;
  torrent_status *st;
  iterator __end2;
  iterator __begin2;
  vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_> *__range2;
  vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_> *ret_local;
  session_impl *this_local;
  status_flags_t flags_local;
  
  __end2 = ::std::vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_>::
           begin(ret);
  st = (torrent_status *)
       ::std::vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_>::end
                 (ret);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<libtorrent::torrent_status_*,_std::vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_>_>
                                     *)&st), bVar1) {
    t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         __gnu_cxx::
         __normal_iterator<libtorrent::torrent_status_*,_std::vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_>_>
         ::operator*(&__end2);
    ::std::weak_ptr<libtorrent::aux::torrent>::lock((weak_ptr<libtorrent::aux::torrent> *)local_50);
    bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_50);
    if (bVar1) {
      this_00 = ::std::
                __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_50);
      torrent::status(this_00,(torrent_status *)
                              t.
                              super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi,flags);
    }
    ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
              ((shared_ptr<libtorrent::aux::torrent> *)local_50);
    __gnu_cxx::
    __normal_iterator<libtorrent::torrent_status_*,_std::vector<libtorrent::torrent_status,_std::allocator<libtorrent::torrent_status>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void session_impl::refresh_torrent_status(std::vector<torrent_status>* ret
		, status_flags_t const flags) const
	{
		for (auto& st : *ret)
		{
			auto t = st.handle.m_torrent.lock();
			if (!t) continue;
			t->status(&st, flags);
		}
	}